

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_decimal_result<wchar_t_*> __thiscall
fmt::v8::detail::format_decimal<wchar_t,unsigned__int128>
          (detail *this,wchar_t *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined8 unaff_RBX;
  detail *pdVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  detail *pdVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  format_decimal_result<wchar_t_*> fVar11;
  detail *pdVar12;
  
  uVar3 = CONCAT44(in_register_00000014,size);
  auVar10._8_8_ = unaff_RBX;
  auVar10._0_8_ = in_RAX;
  iVar2 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar10);
  if (in_ECX < iVar2) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pdVar4 = this + (long)in_ECX * 4;
  pwVar5 = out;
  uVar6 = uVar3;
  pdVar7 = pdVar4;
  pdVar12 = pdVar4;
  if ((out < (wchar_t *)0x64) <= uVar3) {
    do {
      pdVar4 = pdVar7 + -8;
      auVar10 = __udivti3(pwVar5,uVar6,100,0);
      uVar3 = auVar10._8_8_;
      out = auVar10._0_8_;
      *(int *)(pdVar7 + -8) =
           (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [(long)(pwVar5 + (long)out * -0x19) * 2];
      bVar8 = (wchar_t *)0x270f < pwVar5;
      bVar9 = uVar6 != 0;
      uVar1 = -uVar6;
      *(int *)(pdVar7 + -4) =
           (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [(long)(pwVar5 + (long)out * -0x19) * 2 + 1];
      pwVar5 = out;
      uVar6 = uVar3;
      pdVar7 = pdVar4;
    } while (bVar9 || uVar1 < bVar8);
  }
  if (uVar3 == 0 && (ulong)((wchar_t *)0x9 < out) <= -uVar3) {
    *(uint *)(pdVar4 + -4) = (uint)out | 0x30;
    pdVar4 = pdVar4 + -4;
  }
  else {
    *(int *)(pdVar4 + -8) =
         (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [(long)out * 2];
    *(int *)(pdVar4 + -4) =
         (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [(long)out * 2 + 1];
    pdVar4 = pdVar4 + -8;
  }
  fVar11.end = (wchar_t *)pdVar12;
  fVar11.begin = (wchar_t *)pdVar4;
  return fVar11;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}